

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

int Abc_TgPermPhase(Abc_TgMan_t *pMan,int iVar)

{
  byte bVar1;
  word *pIn1;
  int iVar2;
  int nWords;
  int iVar3;
  
  nWords = 1 << ((char)pMan->nVars - 6U & 0x1f);
  if (pMan->nVars < 7) {
    nWords = 1;
  }
  bVar1 = pMan->pPermTRev[iVar];
  iVar3 = 0;
  Abc_TtCopy(Abc_TgPermPhase::pCopy,pMan->pTruth,nWords,0);
  Abc_TtFlip(Abc_TgPermPhase::pCopy,nWords,(int)(char)bVar1);
  pIn1 = pMan->pTruth;
  iVar2 = Abc_TtCompareRev(pIn1,Abc_TgPermPhase::pCopy,nWords);
  if (iVar2 == 1) {
    Abc_TtCopy(pIn1,Abc_TgPermPhase::pCopy,nWords,0);
    pMan->uPhase = pMan->uPhase ^ 1 << (bVar1 & 0x1f);
    iVar3 = 0x10;
  }
  return iVar3;
}

Assistant:

static int Abc_TgPermPhase(Abc_TgMan_t* pMan, int iVar)
{
    static word pCopy[1024];
    int nWords = Abc_TtWordNum(pMan->nVars);
    int ivp = pMan->pPermTRev[iVar];
    Abc_TtCopy(pCopy, pMan->pTruth, nWords, 0);
    Abc_TtFlip(pCopy, nWords, ivp);
    if (Abc_TtCompareRev(pMan->pTruth, pCopy, nWords) == 1)
    {
        Abc_TtCopy(pMan->pTruth, pCopy, nWords, 0);
        pMan->uPhase ^= 1 << ivp;
        return 16;
    }
    return 0;
}